

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86formatter.cpp
# Opt level: O3

Error asmjit::x86::FormatterInternal_formatImmBits
                (String *sb,uint32_t u8,ImmBits *bits,uint32_t count)

{
  uint id;
  Error EVar1;
  char *str;
  ulong uVar2;
  int iVar3;
  char *__format;
  bool bVar4;
  char buf [64];
  
  uVar2 = (ulong)count;
  __format = bits->text;
  iVar3 = 0;
  do {
    bVar4 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar4) {
      if ((iVar3 != 0) && (EVar1 = String::append(sb,'}'), EVar1 != 0)) {
        return EVar1;
      }
      return 0;
    }
    id = (((ImmBits *)(__format + -3))->mask & u8) >> (__format[-2] & 0x1fU);
    if (__format[-1] == '\x01') {
      snprintf(buf,0x40,__format,(ulong)id);
      str = buf;
    }
    else {
      if (__format[-1] != '\0') {
        return 3;
      }
      str = Support::findPackedString(__format,id);
    }
    if (*str != '\0') {
      EVar1 = String::append(sb,'|' - (iVar3 == 0));
      if (EVar1 != 0) {
        return EVar1;
      }
      EVar1 = String::append(sb,str,0xffffffffffffffff);
      if (EVar1 != 0) {
        return EVar1;
      }
      iVar3 = iVar3 + 1;
    }
    __format = __format + 0x30;
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SIZE static Error FormatterInternal_formatImmBits(String& sb, uint32_t u8, const ImmBits* bits, uint32_t count) noexcept {
  uint32_t n = 0;
  char buf[64];

  for (uint32_t i = 0; i < count; i++) {
    const ImmBits& spec = bits[i];

    uint32_t value = (u8 & uint32_t(spec.mask)) >> spec.shift;
    const char* str = nullptr;

    switch (spec.mode) {
      case ImmBits::kModeLookup:
        str = Support::findPackedString(spec.text, value);
        break;

      case ImmBits::kModeFormat:
        snprintf(buf, sizeof(buf), spec.text, unsigned(value));
        str = buf;
        break;

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    if (!str[0])
      continue;

    ASMJIT_PROPAGATE(sb.append(++n == 1 ? kImmCharStart : kImmCharOr));
    ASMJIT_PROPAGATE(sb.append(str));
  }

  if (n && kImmCharEnd)
    ASMJIT_PROPAGATE(sb.append(kImmCharEnd));

  return kErrorOk;
}